

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

double __thiscall VCClusterAniso::energyWithItem(VCClusterAniso *this,VCFace *f)

{
  MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
  *in_RDI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  ReturnType RVar1;
  Vector3d zi;
  Vector3d sKP;
  Matrix3d sK;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffee0;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffee8;
  MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
  *in_stack_fffffffffffffef0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffef8;
  Vector3d *in_stack_ffffffffffffff78;
  Matrix3d *in_stack_ffffffffffffff80;
  VCClusterAniso *in_stack_ffffffffffffff88;
  
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffef8,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffef0);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffef0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffffee8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,1,0,3,1>const&,6>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffef0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>_>
              *)in_stack_fffffffffffffee8);
  center(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  this_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
            dot<Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,1,0,3,1>const&,6>>
                      (in_stack_fffffffffffffee0,in_RDI);
  RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    (this_00,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDI);
  return (double)this_00 - (RVar1 + RVar1);
}

Assistant:

double VCClusterAniso::energyWithItem(VCFace* f) {
	Matrix3d sK = sumK + f->K;
	Vector3d sKP = sumKPos + f->K * f->center;
	Vector3d zi = center(sK, sKP);
	return zi.dot(sK * zi) - 2 * zi.dot(sKP);
}